

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_LANG_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 1) {
    *s_out = "DW_LANG_C89";
    s_out_local._4_4_ = 0;
  }
  else if (val == 2) {
    *s_out = "DW_LANG_C";
    s_out_local._4_4_ = 0;
  }
  else if (val == 3) {
    *s_out = "DW_LANG_Ada83";
    s_out_local._4_4_ = 0;
  }
  else if (val == 4) {
    *s_out = "DW_LANG_C_plus_plus";
    s_out_local._4_4_ = 0;
  }
  else if (val == 5) {
    *s_out = "DW_LANG_Cobol74";
    s_out_local._4_4_ = 0;
  }
  else if (val == 6) {
    *s_out = "DW_LANG_Cobol85";
    s_out_local._4_4_ = 0;
  }
  else if (val == 7) {
    *s_out = "DW_LANG_Fortran77";
    s_out_local._4_4_ = 0;
  }
  else if (val == 8) {
    *s_out = "DW_LANG_Fortran90";
    s_out_local._4_4_ = 0;
  }
  else if (val == 9) {
    *s_out = "DW_LANG_Pascal83";
    s_out_local._4_4_ = 0;
  }
  else if (val == 10) {
    *s_out = "DW_LANG_Modula2";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb) {
    *s_out = "DW_LANG_Java";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xc) {
    *s_out = "DW_LANG_C99";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xd) {
    *s_out = "DW_LANG_Ada95";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xe) {
    *s_out = "DW_LANG_Fortran95";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xf) {
    *s_out = "DW_LANG_PLI";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x10) {
    *s_out = "DW_LANG_ObjC";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x11) {
    *s_out = "DW_LANG_ObjC_plus_plus";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x12) {
    *s_out = "DW_LANG_UPC";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x13) {
    *s_out = "DW_LANG_D";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x14) {
    *s_out = "DW_LANG_Python";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x15) {
    *s_out = "DW_LANG_OpenCL";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x16) {
    *s_out = "DW_LANG_Go";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x17) {
    *s_out = "DW_LANG_Modula3";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x18) {
    *s_out = "DW_LANG_Haskel";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x19) {
    *s_out = "DW_LANG_C_plus_plus_03";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1a) {
    *s_out = "DW_LANG_C_plus_plus_11";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1b) {
    *s_out = "DW_LANG_OCaml";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1c) {
    *s_out = "DW_LANG_Rust";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1d) {
    *s_out = "DW_LANG_C11";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1e) {
    *s_out = "DW_LANG_Swift";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1f) {
    *s_out = "DW_LANG_Julia";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x20) {
    *s_out = "DW_LANG_Dylan";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x21) {
    *s_out = "DW_LANG_C_plus_plus_14";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x22) {
    *s_out = "DW_LANG_Fortran03";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x23) {
    *s_out = "DW_LANG_Fortran08";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x24) {
    *s_out = "DW_LANG_RenderScript";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x25) {
    *s_out = "DW_LANG_BLISS";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x26) {
    *s_out = "DW_LANG_Kotlin";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x27) {
    *s_out = "DW_LANG_Zig";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x28) {
    *s_out = "DW_LANG_Crystal";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2a) {
    *s_out = "DW_LANG_C_plus_plus_17";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2b) {
    *s_out = "DW_LANG_C_plus_plus_20";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2c) {
    *s_out = "DW_LANG_C17";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2d) {
    *s_out = "DW_LANG_Fortran18";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2e) {
    *s_out = "DW_LANG_Ada2005";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2f) {
    *s_out = "DW_LANG_Ada2012";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x30) {
    *s_out = "DW_LANG_HIP";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x31) {
    *s_out = "DW_LANG_Assembly";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x32) {
    *s_out = "DW_LANG_C_sharp";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x33) {
    *s_out = "DW_LANG_Mojo";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x34) {
    *s_out = "DW_LANG_GLSL";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x35) {
    *s_out = "DW_LANG_GLSL_ES";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x36) {
    *s_out = "DW_LANG_HLSL";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x37) {
    *s_out = "DW_LANG_OpenCL_CPP";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x38) {
    *s_out = "DW_LANG_CPP_for_OpenCL";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x39) {
    *s_out = "DW_LANG_SYCL";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x40) {
    *s_out = "DW_LANG_Ruby";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x41) {
    *s_out = "DW_LANG_Move";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x42) {
    *s_out = "DW_LANG_Hylo";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8000) {
    *s_out = "DW_LANG_lo_user";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8001) {
    *s_out = "DW_LANG_Mips_Assembler";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8765) {
    *s_out = "DW_LANG_Upc";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8e57) {
    *s_out = "DW_LANG_GOOGLE_RenderScript";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x9001) {
    *s_out = "DW_LANG_SUN_Assembler";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x9101) {
    *s_out = "DW_LANG_ALTIUM_Assembler";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb000) {
    *s_out = "DW_LANG_BORLAND_Delphi";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xffff) {
    *s_out = "DW_LANG_hi_user";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_LANG_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_LANG_C89:
        *s_out = "DW_LANG_C89";
        return DW_DLV_OK;
    case DW_LANG_C:
        *s_out = "DW_LANG_C";
        return DW_DLV_OK;
    case DW_LANG_Ada83:
        *s_out = "DW_LANG_Ada83";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus:
        *s_out = "DW_LANG_C_plus_plus";
        return DW_DLV_OK;
    case DW_LANG_Cobol74:
        *s_out = "DW_LANG_Cobol74";
        return DW_DLV_OK;
    case DW_LANG_Cobol85:
        *s_out = "DW_LANG_Cobol85";
        return DW_DLV_OK;
    case DW_LANG_Fortran77:
        *s_out = "DW_LANG_Fortran77";
        return DW_DLV_OK;
    case DW_LANG_Fortran90:
        *s_out = "DW_LANG_Fortran90";
        return DW_DLV_OK;
    case DW_LANG_Pascal83:
        *s_out = "DW_LANG_Pascal83";
        return DW_DLV_OK;
    case DW_LANG_Modula2:
        *s_out = "DW_LANG_Modula2";
        return DW_DLV_OK;
    case DW_LANG_Java:
        *s_out = "DW_LANG_Java";
        return DW_DLV_OK;
    case DW_LANG_C99:
        *s_out = "DW_LANG_C99";
        return DW_DLV_OK;
    case DW_LANG_Ada95:
        *s_out = "DW_LANG_Ada95";
        return DW_DLV_OK;
    case DW_LANG_Fortran95:
        *s_out = "DW_LANG_Fortran95";
        return DW_DLV_OK;
    case DW_LANG_PLI:
        *s_out = "DW_LANG_PLI";
        return DW_DLV_OK;
    case DW_LANG_ObjC:
        *s_out = "DW_LANG_ObjC";
        return DW_DLV_OK;
    case DW_LANG_ObjC_plus_plus:
        *s_out = "DW_LANG_ObjC_plus_plus";
        return DW_DLV_OK;
    case DW_LANG_UPC:
        *s_out = "DW_LANG_UPC";
        return DW_DLV_OK;
    case DW_LANG_D:
        *s_out = "DW_LANG_D";
        return DW_DLV_OK;
    case DW_LANG_Python:
        *s_out = "DW_LANG_Python";
        return DW_DLV_OK;
    case DW_LANG_OpenCL:
        *s_out = "DW_LANG_OpenCL";
        return DW_DLV_OK;
    case DW_LANG_Go:
        *s_out = "DW_LANG_Go";
        return DW_DLV_OK;
    case DW_LANG_Modula3:
        *s_out = "DW_LANG_Modula3";
        return DW_DLV_OK;
    case DW_LANG_Haskel:
        *s_out = "DW_LANG_Haskel";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_03:
        *s_out = "DW_LANG_C_plus_plus_03";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_11:
        *s_out = "DW_LANG_C_plus_plus_11";
        return DW_DLV_OK;
    case DW_LANG_OCaml:
        *s_out = "DW_LANG_OCaml";
        return DW_DLV_OK;
    case DW_LANG_Rust:
        *s_out = "DW_LANG_Rust";
        return DW_DLV_OK;
    case DW_LANG_C11:
        *s_out = "DW_LANG_C11";
        return DW_DLV_OK;
    case DW_LANG_Swift:
        *s_out = "DW_LANG_Swift";
        return DW_DLV_OK;
    case DW_LANG_Julia:
        *s_out = "DW_LANG_Julia";
        return DW_DLV_OK;
    case DW_LANG_Dylan:
        *s_out = "DW_LANG_Dylan";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_14:
        *s_out = "DW_LANG_C_plus_plus_14";
        return DW_DLV_OK;
    case DW_LANG_Fortran03:
        *s_out = "DW_LANG_Fortran03";
        return DW_DLV_OK;
    case DW_LANG_Fortran08:
        *s_out = "DW_LANG_Fortran08";
        return DW_DLV_OK;
    case DW_LANG_RenderScript:
        *s_out = "DW_LANG_RenderScript";
        return DW_DLV_OK;
    case DW_LANG_BLISS:
        *s_out = "DW_LANG_BLISS";
        return DW_DLV_OK;
    case DW_LANG_Kotlin:
        *s_out = "DW_LANG_Kotlin";
        return DW_DLV_OK;
    case DW_LANG_Zig:
        *s_out = "DW_LANG_Zig";
        return DW_DLV_OK;
    case DW_LANG_Crystal:
        *s_out = "DW_LANG_Crystal";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_17:
        *s_out = "DW_LANG_C_plus_plus_17";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_20:
        *s_out = "DW_LANG_C_plus_plus_20";
        return DW_DLV_OK;
    case DW_LANG_C17:
        *s_out = "DW_LANG_C17";
        return DW_DLV_OK;
    case DW_LANG_Fortran18:
        *s_out = "DW_LANG_Fortran18";
        return DW_DLV_OK;
    case DW_LANG_Ada2005:
        *s_out = "DW_LANG_Ada2005";
        return DW_DLV_OK;
    case DW_LANG_Ada2012:
        *s_out = "DW_LANG_Ada2012";
        return DW_DLV_OK;
    case DW_LANG_HIP:
        *s_out = "DW_LANG_HIP";
        return DW_DLV_OK;
    case DW_LANG_Assembly:
        *s_out = "DW_LANG_Assembly";
        return DW_DLV_OK;
    case DW_LANG_C_sharp:
        *s_out = "DW_LANG_C_sharp";
        return DW_DLV_OK;
    case DW_LANG_Mojo:
        *s_out = "DW_LANG_Mojo";
        return DW_DLV_OK;
    case DW_LANG_GLSL:
        *s_out = "DW_LANG_GLSL";
        return DW_DLV_OK;
    case DW_LANG_GLSL_ES:
        *s_out = "DW_LANG_GLSL_ES";
        return DW_DLV_OK;
    case DW_LANG_HLSL:
        *s_out = "DW_LANG_HLSL";
        return DW_DLV_OK;
    case DW_LANG_OpenCL_CPP:
        *s_out = "DW_LANG_OpenCL_CPP";
        return DW_DLV_OK;
    case DW_LANG_CPP_for_OpenCL:
        *s_out = "DW_LANG_CPP_for_OpenCL";
        return DW_DLV_OK;
    case DW_LANG_SYCL:
        *s_out = "DW_LANG_SYCL";
        return DW_DLV_OK;
    case DW_LANG_Ruby:
        *s_out = "DW_LANG_Ruby";
        return DW_DLV_OK;
    case DW_LANG_Move:
        *s_out = "DW_LANG_Move";
        return DW_DLV_OK;
    case DW_LANG_Hylo:
        *s_out = "DW_LANG_Hylo";
        return DW_DLV_OK;
    case DW_LANG_lo_user:
        *s_out = "DW_LANG_lo_user";
        return DW_DLV_OK;
    case DW_LANG_Mips_Assembler:
        *s_out = "DW_LANG_Mips_Assembler";
        return DW_DLV_OK;
    case DW_LANG_Upc:
        *s_out = "DW_LANG_Upc";
        return DW_DLV_OK;
    case DW_LANG_GOOGLE_RenderScript:
        *s_out = "DW_LANG_GOOGLE_RenderScript";
        return DW_DLV_OK;
    case DW_LANG_SUN_Assembler:
        *s_out = "DW_LANG_SUN_Assembler";
        return DW_DLV_OK;
    case DW_LANG_ALTIUM_Assembler:
        *s_out = "DW_LANG_ALTIUM_Assembler";
        return DW_DLV_OK;
    case DW_LANG_BORLAND_Delphi:
        *s_out = "DW_LANG_BORLAND_Delphi";
        return DW_DLV_OK;
    case DW_LANG_hi_user:
        *s_out = "DW_LANG_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}